

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double normal_truncated_a_variance(double mu,double s,double a)

{
  double dVar1;
  double dVar2;
  double x;
  double dVar3;
  
  x = (a - mu) / s;
  dVar1 = exp(x * -0.5 * x);
  dVar2 = normal_01_cdf(x);
  dVar3 = (dVar1 / 2.5066282746310002) / (1.0 - dVar2);
  return (((x * (dVar1 / 2.5066282746310002)) / (1.0 - dVar2) + 1.0) - dVar3 * dVar3) * s * s;
}

Assistant:

double normal_truncated_a_variance ( double mu, double s, double a )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_TRUNCATED_A_VARIANCE: variance of the lower truncated Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    21 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double MU, S, the mean and standard deviation of the
//    parent Normal distribution.
//
//    Input, double A, the lower truncation limit.
//
//    Output, double NORMAL_TRUNCATED_A_VARIANCE, the variance of the PDF.
//
{
  double alpha;
  double alpha_cdf;
  double alpha_pdf;
  double variance;

  alpha = ( a - mu ) / s;

  alpha_pdf = normal_01_pdf ( alpha );

  alpha_cdf = normal_01_cdf ( alpha );

  variance = s * s * ( 1.0 
    + alpha * alpha_pdf / ( 1.0 - alpha_cdf ) 
    - pow ( alpha_pdf / ( 1.0 - alpha_cdf ), 2 ) );

  return variance;
}